

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

void __thiscall
llvm::SmallVector<unsigned_char,_4U>::SmallVector
          (SmallVector<unsigned_char,_4U> *this,SmallVector<unsigned_char,_4U> *RHS)

{
  (this->super_SmallVectorImpl<unsigned_char>).super_SmallVectorTemplateBase<unsigned_char,_true>.
  super_SmallVectorTemplateCommon<unsigned_char,_void>.super_SmallVectorBase.BeginX =
       &this->super_SmallVectorStorage<unsigned_char,_4U>;
  (this->super_SmallVectorImpl<unsigned_char>).super_SmallVectorTemplateBase<unsigned_char,_true>.
  super_SmallVectorTemplateCommon<unsigned_char,_void>.super_SmallVectorBase.Size = 0;
  (this->super_SmallVectorImpl<unsigned_char>).super_SmallVectorTemplateBase<unsigned_char,_true>.
  super_SmallVectorTemplateCommon<unsigned_char,_void>.super_SmallVectorBase.Capacity = 4;
  if ((RHS->super_SmallVectorImpl<unsigned_char>).super_SmallVectorTemplateBase<unsigned_char,_true>
      .super_SmallVectorTemplateCommon<unsigned_char,_void>.super_SmallVectorBase.Size != 0) {
    SmallVectorImpl<unsigned_char>::operator=
              (&this->super_SmallVectorImpl<unsigned_char>,
               &RHS->super_SmallVectorImpl<unsigned_char>);
  }
  return;
}

Assistant:

SmallVector(SmallVector &&RHS) : SmallVectorImpl<T>(N) {
    if (!RHS.empty())
      SmallVectorImpl<T>::operator=(::std::move(RHS));
  }